

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = TreeNode(label,"%s (%d)",label,(ulong)(uint)windows->Size);
  if (!bVar1) {
    return;
  }
  Text("(In front-to-back order:)");
  uVar2 = (ulong)windows->Size;
  if (0 < (long)uVar2) {
    do {
      if (((long)windows->Size < (long)uVar2) ||
         (PushID(windows->Data[uVar2 - 1]), (long)windows->Size < (long)uVar2)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      DebugNodeWindow(windows->Data[uVar2 - 1],"Window");
      PopID();
      bVar1 = 1 < uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeWindowsList(ImVector<ImGuiWindow*>* windows, const char* label)
{
    if (!TreeNode(label, "%s (%d)", label, windows->Size))
        return;
    Text("(In front-to-back order:)");
    for (int i = windows->Size - 1; i >= 0; i--) // Iterate front to back
    {
        PushID((*windows)[i]);
        DebugNodeWindow((*windows)[i], "Window");
        PopID();
    }
    TreePop();
}